

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O1

int cgltf_parse_json_vec3
              (cgltf_options *options,jsmntok_t *tokens,int i,uint8_t *json_chunk,float **out_array,
              cgltf_size *out_size)

{
  jsmntok_t *tok;
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  cgltf_float cVar9;
  ulong local_68;
  
  iVar3 = -1;
  if (tokens[i].type == JSMN_OBJECT) {
    iVar1 = tokens[i].size;
    if ((2 < iVar1) && (*out_array == (float *)0x0)) {
      pfVar5 = (float *)(*(options->memory).alloc)((options->memory).user_data,0xc);
      if (pfVar5 == (float *)0x0) {
        pfVar5 = (float *)0x0;
      }
      else {
        pfVar5[2] = 0.0;
        pfVar5[0] = 0.0;
        pfVar5[1] = 0.0;
      }
      *out_array = pfVar5;
      if (pfVar5 == (float *)0x0) {
        iVar3 = -2;
      }
      else {
        iVar6 = i + 1;
        iVar3 = 1;
        if (1 < iVar1) {
          iVar3 = iVar1;
        }
        bVar2 = true;
        local_68 = 0;
        iVar7 = 1;
        do {
          if ((tokens[iVar6].type == JSMN_STRING) && (tok = tokens + iVar6, tok->size != 0)) {
            iVar4 = cgltf_json_strcmp(tok,json_chunk,"x");
            if (iVar4 == 0) {
              cVar9 = cgltf_json_to_float(tokens + (long)iVar6 + 1,json_chunk);
              *pfVar5 = cVar9;
LAB_001190ff:
              iVar6 = iVar6 + 2;
              local_68 = local_68 + 1;
            }
            else {
              iVar4 = cgltf_json_strcmp(tok,json_chunk,"y");
              if (iVar4 == 0) {
                cVar9 = cgltf_json_to_float(tokens + (long)iVar6 + 1,json_chunk);
                pfVar5[1] = cVar9;
                goto LAB_001190ff;
              }
              iVar4 = cgltf_json_strcmp(tok,json_chunk,"z");
              if (iVar4 == 0) {
                cVar9 = cgltf_json_to_float(tokens + (long)iVar6 + 1,json_chunk);
                pfVar5[2] = cVar9;
                goto LAB_001190ff;
              }
              iVar6 = cgltf_skip_json(tokens,iVar6 + 1);
            }
            if (iVar6 < 0) break;
          }
          bVar2 = iVar7 < iVar1;
          bVar8 = iVar7 != iVar3;
          iVar7 = iVar7 + 1;
        } while (bVar8);
        iVar3 = iVar6;
        if ((!bVar2) && (iVar3 = -1, 2 < local_68)) {
          *out_size = local_68;
          iVar3 = iVar6;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int cgltf_parse_json_vec3(cgltf_options* options, jsmntok_t const* tokens, int i, const uint8_t* json_chunk, float** out_array, cgltf_size* out_size)
{
	if (tokens[i].type == JSMN_OBJECT) {
		int size = tokens[i].size; ++i;
		if (size < 3) {
			return CGLTF_ERROR_JSON;
		}
		else {
			if (*out_array) {
				return CGLTF_ERROR_JSON;
			}
			*out_array = (float*)cgltf_calloc(options, sizeof(cgltf_float), 3);
			if (!*out_array)
			{
				return CGLTF_ERROR_NOMEM;
			}
		}

		cgltf_size count = 0;
		for (int j = 0; j < size; ++j) {
			if (tokens[i].type != JSMN_STRING || tokens[i].size == 0) {
				continue;
			}
			else if (cgltf_json_strcmp(tokens + i, json_chunk, "x") == 0) {
				++i; (*out_array)[0] = cgltf_json_to_float(tokens + i, json_chunk); ++i;
				++count;
			}
			else if (cgltf_json_strcmp(tokens + i, json_chunk, "y") == 0) {
				++i; (*out_array)[1] = cgltf_json_to_float(tokens + i, json_chunk); ++i;
				++count;
			}
			else if (cgltf_json_strcmp(tokens + i, json_chunk, "z") == 0) {
				++i; (*out_array)[2] = cgltf_json_to_float(tokens + i, json_chunk); ++i;
				++count;
			}
			else {
				i = cgltf_skip_json(tokens, i + 1);
			}
			if (i < 0) return i;
		}
		if (count < 3) {
			return CGLTF_ERROR_JSON;
		}
		*out_size = count;
	}
	else {
		return CGLTF_ERROR_JSON;
	}
	return i;
}